

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# content_encoding.c
# Opt level: O1

gzip_status check_gzip_header(uchar *data,ssize_t len,ssize_t *headerlen)

{
  byte bVar1;
  bool bVar2;
  uchar *puVar3;
  uchar *puVar4;
  ssize_t totallen;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  
  if (len < 10) {
    return GZIP_UNDERFLOW;
  }
  if (*data != '\x1f') {
    return GZIP_BAD;
  }
  if (data[1] != 0x8b) {
    return GZIP_BAD;
  }
  bVar1 = data[3];
  if (0x1f < bVar1 || data[2] != '\b') {
    return GZIP_BAD;
  }
  uVar6 = len - 10;
  puVar3 = data + 10;
  uVar7 = uVar6;
  if ((bVar1 & 4) == 0) goto LAB_0011de0b;
  if (len < 0xc) {
LAB_0011ddf9:
    bVar2 = false;
    uVar7 = uVar6;
  }
  else {
    lVar5 = (ulong)*(ushort *)(data + 10) + 2;
    uVar7 = uVar6 - lVar5;
    if ((long)uVar6 < lVar5) goto LAB_0011ddf9;
    puVar3 = puVar3 + lVar5;
    bVar2 = true;
  }
  if (!bVar2) {
    return GZIP_UNDERFLOW;
  }
LAB_0011de0b:
  if ((bVar1 & 8) == 0) {
LAB_0011de3d:
    if (0xf < bVar1) {
      if (uVar7 == 0) {
        return GZIP_UNDERFLOW;
      }
      uVar6 = 0;
      while (puVar3[uVar6] != '\0') {
        uVar6 = uVar6 + 1;
        if (uVar7 == uVar6) {
          return GZIP_UNDERFLOW;
        }
      }
      uVar7 = uVar7 + ~uVar6;
    }
    if ((bVar1 & 2) != 0) {
      if ((long)uVar7 < 2) {
        return GZIP_UNDERFLOW;
      }
      uVar7 = uVar7 - 2;
    }
    *headerlen = len - uVar7;
    return GZIP_OK;
  }
  if (uVar7 != 0) {
    lVar5 = 1 - uVar7;
    puVar4 = puVar3;
    do {
      puVar3 = puVar4 + 1;
      if (*puVar4 == '\0') {
        uVar7 = -lVar5;
        goto LAB_0011de3d;
      }
      lVar5 = lVar5 + 1;
      puVar4 = puVar3;
    } while (lVar5 != 1);
  }
  return GZIP_UNDERFLOW;
}

Assistant:

static gzip_status check_gzip_header(unsigned char const *data, ssize_t len,
                                     ssize_t *headerlen)
{
  int method, flags;
  const ssize_t totallen = len;

  /* The shortest header is 10 bytes */
  if(len < 10)
    return GZIP_UNDERFLOW;

  if((data[0] != GZIP_MAGIC_0) || (data[1] != GZIP_MAGIC_1))
    return GZIP_BAD;

  method = data[2];
  flags = data[3];

  if(method != Z_DEFLATED || (flags & RESERVED) != 0) {
    /* cannot handle this compression method or unknown flag */
    return GZIP_BAD;
  }

  /* Skip over time, xflags, OS code and all previous bytes */
  len -= 10;
  data += 10;

  if(flags & EXTRA_FIELD) {
    ssize_t extra_len;

    if(len < 2)
      return GZIP_UNDERFLOW;

    extra_len = (data[1] << 8) | data[0];

    if(len < (extra_len + 2))
      return GZIP_UNDERFLOW;

    len -= (extra_len + 2);
    data += (extra_len + 2);
  }

  if(flags & ORIG_NAME) {
    /* Skip over NUL-terminated filename */
    while(len && *data) {
      --len;
      ++data;
    }
    if(!len || *data)
      return GZIP_UNDERFLOW;

    /* Skip over the NUL */
    --len;
    ++data;
  }

  if(flags & COMMENT) {
    /* Skip over NUL-terminated comment */
    while(len && *data) {
      --len;
      ++data;
    }
    if(!len || *data)
      return GZIP_UNDERFLOW;

    /* Skip over the NUL */
    --len;
  }

  if(flags & HEAD_CRC) {
    if(len < 2)
      return GZIP_UNDERFLOW;

    len -= 2;
  }

  *headerlen = totallen - len;
  return GZIP_OK;
}